

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

void uv_library_shutdown(void)

{
  int iVar1;
  
  iVar1 = uv_library_shutdown::was_shutdown;
  LOCK();
  uv_library_shutdown::was_shutdown = 1;
  UNLOCK();
  if (iVar1 != 0) {
    return;
  }
  uv__process_title_cleanup();
  uv__signal_cleanup();
  uv__threadpool_cleanup();
  return;
}

Assistant:

__attribute__((destructor))
#endif
void uv_library_shutdown(void) {
  static int was_shutdown;

  if (uv__exchange_int_relaxed(&was_shutdown, 1))
    return;

  uv__process_title_cleanup();
  uv__signal_cleanup();
#ifdef __MVS__
  /* TODO(itodorov) - zos: revisit when Woz compiler is available. */
  uv__os390_cleanup();
#else
  uv__threadpool_cleanup();
#endif
}